

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

int m256v_LU_decomp_inplace(m256v *A,int *rp,int *cp)

{
  int iVar1;
  uint8_t alpha;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int r1;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  if (0 < A->n_row) {
    lVar2 = 0;
    do {
      rp[lVar2] = (int)lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar2 < A->n_row);
  }
  if (0 < A->n_col) {
    lVar2 = 0;
    do {
      cp[lVar2] = (int)lVar2;
      lVar2 = lVar2 + 1;
      uVar4 = (ulong)A->n_col;
    } while (lVar2 < (long)uVar4);
    if (0 < A->n_col) {
      uVar3 = (ulong)(uint)A->n_row;
      lVar2 = 1;
      uVar8 = 0;
      do {
        if (((long)(int)uVar3 <= (long)uVar8) || ((long)(int)uVar4 <= (long)uVar8))
        goto LAB_00103faa;
        puVar6 = A->e + (A->rstride + 1) * uVar8;
        uVar5 = uVar8;
        uVar9 = uVar8;
        puVar7 = puVar6;
        while (*puVar6 == '\0') {
          uVar5 = uVar5 + 1;
          puVar6 = puVar6 + A->rstride;
          if ((uVar3 & 0xffffffff) == uVar5) {
            uVar9 = uVar9 + 1;
            puVar6 = puVar7 + 1;
            uVar5 = uVar8;
            puVar7 = puVar6;
            if (uVar9 == (uVar4 & 0xffffffff)) goto LAB_00103faa;
          }
        }
        uVar4 = uVar5 & 0xffffffff;
        r1 = (int)uVar8;
        if (uVar4 != uVar8) {
          iVar1 = rp[uVar4];
          rp[uVar4] = rp[uVar8];
          rp[uVar8] = iVar1;
          m256v_swap_rows(A,r1,(int)uVar5);
        }
        uVar4 = uVar9 & 0xffffffff;
        if (uVar4 != uVar8) {
          iVar1 = cp[uVar4];
          cp[uVar4] = cp[uVar8];
          cp[uVar8] = iVar1;
          m256v_swap_cols(A,(int)uVar9,r1);
        }
        alpha = gf256_inv(A->e[uVar8 + A->rstride * uVar8]);
        uVar5 = uVar8 + 1;
        m256v_mult_col_from(A,r1,r1 + 1,alpha);
        uVar3 = (ulong)A->n_row;
        lVar10 = lVar2;
        if ((long)uVar5 < (long)uVar3) {
          do {
            m256v_multadd_row_from(A,r1,r1 + 1,A->e[uVar8 + A->rstride * lVar10],A,(int)lVar10);
            lVar10 = lVar10 + 1;
            uVar3 = (ulong)(uint)A->n_row;
          } while ((int)lVar10 < A->n_row);
        }
        uVar4 = (ulong)A->n_col;
        lVar2 = lVar2 + 1;
        uVar8 = uVar5;
      } while ((long)uVar5 < (long)uVar4);
      uVar8 = uVar5 & 0xffffffff;
      goto LAB_00103faa;
    }
  }
  uVar8 = 0;
LAB_00103faa:
  return (int)uVar8;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}